

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool pmsav7_use_background_region(ARMCPU_conflict1 *cpu,ARMMMUIdx mmu_idx,_Bool is_user)

{
  _Bool _Var1;
  uint64_t uVar2;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,is_user) != 0) {
    return false;
  }
  if (((cpu->env).features & 0x200) == 0) {
    uVar2 = regime_sctlr(&cpu->env,mmu_idx);
    _Var1 = (_Bool)((byte)(uVar2 >> 0x11) & 1);
  }
  else {
    _Var1 = regime_is_secure((CPUARMState_conflict *)(ulong)mmu_idx,mmu_idx);
    _Var1 = (_Bool)(((byte)(cpu->env).v7m.mpu_ctrl[_Var1] & 4) >> 2);
  }
  return _Var1;
}

Assistant:

static bool pmsav7_use_background_region(ARMCPU *cpu,
                                         ARMMMUIdx mmu_idx, bool is_user)
{
    /* Return true if we should use the default memory map as a
     * "background" region if there are no hits against any MPU regions.
     */
    CPUARMState *env = &cpu->env;

    if (is_user) {
        return false;
    }

    if (arm_feature(env, ARM_FEATURE_M)) {
        return env->v7m.mpu_ctrl[regime_is_secure(env, mmu_idx)]
            & R_V7M_MPU_CTRL_PRIVDEFENA_MASK;
    } else {
        return regime_sctlr(env, mmu_idx) & SCTLR_BR;
    }
}